

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

value class_metadata(klass cls)

{
  value pvVar1;
  klass cls_00;
  char *pcVar2;
  value pvVar3;
  class_interface pcVar4;
  vector pvVar5;
  value c;
  value *c_map;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  klass in_stack_fffffffffffffff8;
  
  pvVar1 = value_create_map(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (pvVar1 != (value)0x0) {
    cls_00 = (klass)value_to_map((value)0x10991c);
    pcVar2 = (char *)class_metadata_name(cls_00);
    cls_00->name = pcVar2;
    if (cls_00->name != (char *)0x0) {
      pvVar3 = class_metadata_constructors(in_stack_fffffffffffffff8);
      *(value *)&cls_00->accessor = pvVar3;
      if (*(long *)&cls_00->accessor != 0) {
        pvVar3 = class_metadata_methods((klass)0x109977);
        cls_00->impl = pvVar3;
        if (cls_00->impl != (class_impl)0x0) {
          pcVar4 = (class_interface)class_metadata_static_methods((klass)0x10999b);
          cls_00->interface = pcVar4;
          if (cls_00->interface != (class_interface)0x0) {
            pvVar3 = class_metadata_attributes((klass)0x1099bf);
            (cls_00->ref).count = (atomic_uintmax_t)pvVar3;
            if ((cls_00->ref).count != 0) {
              pvVar5 = (vector)class_metadata_static_attributes((klass)0x1099e3);
              cls_00->constructors = pvVar5;
              if (cls_00->constructors != (vector)0x0) {
                return pvVar1;
              }
            }
          }
        }
      }
    }
    value_type_destroy(in_stack_00000050);
  }
  return (value)0x0;
}

Assistant:

value class_metadata(klass cls)
{
	/* The structure of the metadata is:
	* {
	*	name: "ClassName",
	*	constructors: [{}],
	*	methods: [{}],
	*	static_methods: [{}],
	*	attributes: {
	*		"attr1": {}
	*	},
	*	static_attributes: {
	*		"static_attr1": {}
	*	}
	* }
	*/

	/* Create class map (name + constructors + methods + static_methods + attributes + static_attributes) */
	value *c_map, c = value_create_map(NULL, 6);

	if (c == NULL)
	{
		return NULL;
	}

	c_map = value_to_map(c);

	/* Create class name array */
	c_map[0] = class_metadata_name(cls);

	if (c_map[0] == NULL)
	{
		goto error_value;
	}

	/* Create constructors array */
	c_map[1] = class_metadata_constructors(cls);

	if (c_map[1] == NULL)
	{
		goto error_value;
	}

	/* Create class methods array */
	c_map[2] = class_metadata_methods(cls);

	if (c_map[2] == NULL)
	{
		goto error_value;
	}

	/* Create class static_methods array */
	c_map[3] = class_metadata_static_methods(cls);

	if (c_map[3] == NULL)
	{
		goto error_value;
	}

	/* Create class attributes array */
	c_map[4] = class_metadata_attributes(cls);

	if (c_map[4] == NULL)
	{
		goto error_value;
	}

	/* Create class static_attributes array */
	c_map[5] = class_metadata_static_attributes(cls);

	if (c_map[5] == NULL)
	{
		goto error_value;
	}

	return c;

error_value:
	value_type_destroy(c);
	return NULL;
}